

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

void __thiscall
MipsOpcodeFormatter::handleImmediate
          (MipsOpcodeFormatter *this,MipsImmediateType type,uint originalValue,uint opcodeFlags)

{
  string local_c0;
  string local_a0;
  uint local_7c;
  string local_78;
  float local_44;
  string local_40;
  uint local_1c;
  uint local_18;
  uint opcodeFlags_local;
  uint originalValue_local;
  MipsImmediateType type_local;
  MipsOpcodeFormatter *this_local;
  
  local_1c = opcodeFlags;
  local_18 = originalValue;
  opcodeFlags_local = type;
  _originalValue_local = this;
  if (type == Immediate16) {
    if (((opcodeFlags & 2) == 0) && ((originalValue & 0x8000) != 0)) {
      local_7c = 0x10000 - (originalValue & 0xffff);
      tinyformat::format<unsigned_int>(&local_78,"-0x%X",&local_7c);
      std::__cxx11::string::operator+=((string *)this,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      tinyformat::format<unsigned_int>(&local_a0,"0x%X",&local_18);
      std::__cxx11::string::operator+=((string *)this,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  else if (type == ImmediateHalfFloat) {
    local_44 = bitsToFloat(originalValue);
    tinyformat::format<float>(&local_40,"%f",&local_44);
    std::__cxx11::string::operator+=((string *)this,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    tinyformat::format<unsigned_int>(&local_c0,"0x%X",&local_18);
    std::__cxx11::string::operator+=((string *)this,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void MipsOpcodeFormatter::handleImmediate(MipsImmediateType type, unsigned int originalValue, unsigned int opcodeFlags)
{
	switch (type)
	{
	case MipsImmediateType::ImmediateHalfFloat:
		buffer += tfm::format("%f", bitsToFloat(originalValue));
		break;
	case MipsImmediateType::Immediate16:
		if (!(opcodeFlags & MO_IPCR) && originalValue & 0x8000)
			buffer += tfm::format("-0x%X", 0x10000-(originalValue & 0xFFFF));
		else
			buffer += tfm::format("0x%X", originalValue);
		break;
	default:
		buffer += tfm::format("0x%X", originalValue);
		break;
	}
}